

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_file.c
# Opt level: O1

int nni_plat_file_put(char *name,void *data,size_t len)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  int *piVar6;
  FILE *__s;
  size_t sVar7;
  
  pcVar4 = strchr(name,0x2f);
  if (pcVar4 != (char *)0x0) {
    pcVar4 = nni_strdup(name);
    if (pcVar4 == (char *)0x0) {
      iVar3 = 2;
    }
    else {
      pcVar5 = strchr(pcVar4,0x2f);
      iVar3 = 0;
      for (; pcVar5 != (char *)0x0; pcVar5 = strchr(pcVar5,0x2f)) {
        if (pcVar5 != pcVar4) {
          *pcVar5 = '\0';
          iVar2 = mkdir(pcVar4,0x1c0);
          *pcVar5 = '/';
          if (iVar2 != 0) {
            piVar6 = __errno_location();
            if (*piVar6 != 0x11) {
              iVar3 = nni_plat_errno(*piVar6);
              break;
            }
          }
        }
        pcVar5 = pcVar5 + -1;
        do {
          pcVar1 = pcVar5 + 1;
          pcVar5 = pcVar5 + 1;
        } while (*pcVar1 == '/');
      }
      nni_strfree(pcVar4);
    }
    if (iVar3 != 0) {
      return iVar3;
    }
  }
  __s = fopen(name,"wb");
  if (__s != (FILE *)0x0) {
    sVar7 = fwrite(data,1,len,__s);
    iVar3 = 0;
    if (sVar7 != len) {
      piVar6 = __errno_location();
      iVar3 = nni_plat_errno(*piVar6);
      unlink(name);
    }
    fclose(__s);
    return iVar3;
  }
  piVar6 = __errno_location();
  iVar3 = nni_plat_errno(*piVar6);
  return iVar3;
}

Assistant:

int
nni_plat_file_put(const char *name, const void *data, size_t len)
{
	FILE *f;
	int   rv = 0;

	// It is possible that the name contains a directory path
	// that does not exist.  In this case we try to create the
	// entire tree.
	if (strchr(name, '/') != NULL) {
		if ((rv = nni_plat_make_parent_dirs(name)) != 0) {
			return (rv);
		}
	}

	if ((f = fopen(name, "wb")) == NULL) {
		return (nni_plat_errno(errno));
	}
	if (fwrite(data, 1, len, f) != len) {
		rv = nni_plat_errno(errno);
		(void) unlink(name);
	}
	(void) fclose(f);
	return (rv);
}